

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::clara::detail::BasicResult<void>::enforceOk(BasicResult<void> *this)

{
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type == Ok) {
    return;
  }
  abort();
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }